

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O0

uint32_t getTagNumber(char *tagname)

{
  int iVar1;
  uint local_1c;
  uint32_t tagNum;
  char *tagname_local;
  
  if (gMainTable.tagList != (uint16_t *)0x0) {
    for (local_1c = 0; local_1c < gMainTable.tagListSize; local_1c = local_1c + 1) {
      iVar1 = uprv_stricmp_63((char *)(gMainTable.stringTable +
                                      (int)(uint)gMainTable.tagList[local_1c]),tagname);
      if (iVar1 == 0) {
        return local_1c;
      }
    }
  }
  return 0xffffffff;
}

Assistant:

static uint32_t getTagNumber(const char *tagname) {
    if (gMainTable.tagList) {
        uint32_t tagNum;
        for (tagNum = 0; tagNum < gMainTable.tagListSize; tagNum++) {
            if (!uprv_stricmp(GET_STRING(gMainTable.tagList[tagNum]), tagname)) {
                return tagNum;
            }
        }
    }

    return UINT32_MAX;
}